

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

char * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::TryAllocFromZeroPages
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,uint pageCount,PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment)

{
  char *pcVar1;
  BackgroundPageQueue *bgPageQueue;
  bool isPendingZeroList;
  
  if (DAT_0145c440 != '\x01') {
    return (char *)0x0;
  }
  bgPageQueue = this->backgroundPageQueue;
  if (bgPageQueue == (BackgroundPageQueue *)0x0) {
    if (this->hasZeroQueuedPages != true) {
      return (char *)0x0;
    }
    isPendingZeroList = true;
    bgPageQueue = (BackgroundPageQueue *)0x0;
  }
  else {
    isPendingZeroList = false;
  }
  pcVar1 = TryAllocFromZeroPagesList(this,pageCount,pageSegment,bgPageQueue,isPendingZeroList);
  return pcVar1;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TryAllocFromZeroPages(uint pageCount, TPageSegment ** pageSegment)
{
#if ENABLE_BACKGROUND_PAGE_ZEROING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        if (backgroundPageQueue != nullptr)
        {
            return TryAllocFromZeroPagesList(pageCount, pageSegment, backgroundPageQueue, false);
        }

        if (this->hasZeroQueuedPages)
        {
            __analysis_assume(backgroundPageQueue != nullptr);
            return TryAllocFromZeroPagesList(pageCount, pageSegment, backgroundPageQueue, true);
        }
    }
#endif

    return nullptr;
}